

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_> *
expectedValues<libcellml::CellmlElementType>
          (vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
           *__return_storage_ptr__,size_t size,CellmlElementType value)

{
  CellmlElementType local_1c;
  size_t sStack_18;
  CellmlElementType value_local;
  size_t size_local;
  vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_> *res;
  
  local_1c = value;
  sStack_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  std::vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::vector
            (__return_storage_ptr__);
  std::vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::assign
            (__return_storage_ptr__,sStack_18,&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> expectedValues(size_t size, T value)
{
    std::vector<T> res;

    res.assign(size, value);

    return res;
}